

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SstReader.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::SstReader::SstReader(SstReader *this,IO *io,string *name,Mode mode,Comm *comm)

{
  char *__dest;
  SstStream Stream;
  allocator local_113;
  allocator local_112;
  allocator local_111;
  Comm local_110;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,"SstReader",(allocator *)&local_108);
  helper::Comm::Comm(&local_110,comm);
  Engine::Engine(&this->super_Engine,&local_48,io,name,mode,&local_110);
  helper::Comm::~Comm(&local_110);
  std::__cxx11::string::~string((string *)&local_48);
  (this->super_Engine)._vptr_Engine = (_func_int **)&PTR__SstReader_00826748;
  this->m_DefinitionsNotified = false;
  this->m_CurrentStepMetaData = (SstFullMetadata)0x0;
  this->m_BP5Deserializer = (BP5Deserializer *)0x0;
  (this->m_InfoMap)._M_h._M_buckets = &(this->m_InfoMap)._M_h._M_single_bucket;
  (this->m_InfoMap)._M_h._M_bucket_count = 1;
  (this->m_InfoMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_InfoMap)._M_h._M_element_count = 0;
  (this->m_InfoMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_InfoMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_InfoMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  __dest = (char *)operator_new__(name->_M_string_length + 1);
  strcpy(__dest,(name->_M_dataplus)._M_p);
  Init(this);
  Stream = SstReaderOpen(__dest,&this->Params,&(this->super_Engine).m_Comm);
  this->m_Input = Stream;
  if (Stream == (SstStream)0x0) {
    operator_delete__(__dest);
    std::__cxx11::string::string((string *)&local_108,"Engine",&local_111);
    std::__cxx11::string::string((string *)&local_68,"SstReader",&local_112);
    std::__cxx11::string::string((string *)&local_88,"SstReader",&local_113);
    std::operator+(&local_e8,"SstReader did not find active Writer contact info in file \"",
                   &(this->super_Engine).m_Name);
    std::operator+(&local_c8,&local_e8,".sst");
    std::operator+(&local_a8,&local_c8,"\".  Timeout or non-current SST contact file?");
    helper::Throw<std::runtime_error>(&local_108,&local_68,&local_88,&local_a8,-1);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_108);
    Stream = this->m_Input;
  }
  SstReaderGetParams(Stream,&this->m_WriterMarshalMethod,&this->m_WriterIsRowMajor);
  SstReaderInitFFSCallback
            (this->m_Input,this,SstReader::anon_class_1_0_00000001::__invoke,
             SstReader::anon_class_1_0_00000001::__invoke,
             SstReader::anon_class_1_0_00000001::__invoke,
             SstReader::anon_class_1_0_00000001::__invoke,
             SstReader::anon_class_1_0_00000001::__invoke);
  operator_delete__(__dest);
  (this->super_Engine).m_IsOpen = true;
  return;
}

Assistant:

SstReader::SstReader(IO &io, const std::string &name, const Mode mode, helper::Comm comm)
: Engine("SstReader", io, name, mode, std::move(comm))
{
    char *cstr = new char[name.length() + 1];
    std::strcpy(cstr, name.c_str());

    Init();

    m_Input = SstReaderOpen(cstr, &Params, &m_Comm);
    if (!m_Input)
    {
        delete[] cstr;
        helper::Throw<std::runtime_error>("Engine", "SstReader", "SstReader",
                                          "SstReader did not find active "
                                          "Writer contact info in file \"" +
                                              m_Name + SST_POSTFIX +
                                              "\".  Timeout or non-current SST contact file?");
    }

    // Maybe need other writer-side params in the future, but for now only
    // marshal method, and if the writer is row major.
    SstReaderGetParams(m_Input, &m_WriterMarshalMethod, &m_WriterIsRowMajor);

    auto varFFSCallback = [](void *reader, const char *variableName, const int type, void *data) {
        adios2::DataType Type = (adios2::DataType)type;
        class SstReader::SstReader *Reader = reinterpret_cast<class SstReader::SstReader *>(reader);
        if (Type == adios2::DataType::Struct)
        {
            return (void *)NULL;
        }

#define declare_type(T)                                                                            \
    else if (Type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        Variable<T> *variable = &(Reader->m_IO.DefineVariable<T>(variableName));                   \
        variable->SetData((T *)data);                                                              \
        variable->m_AvailableStepsCount = 1;                                                       \
        Reader->RegisterCreatedVariable(variable);                                                 \
        return (void *)variable;                                                                   \
    }

        ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type

        return (void *)NULL;
    };

    auto attrFFSCallback = [](void *reader, const char *attrName, const int type, void *data) {
        class SstReader::SstReader *Reader = reinterpret_cast<class SstReader::SstReader *>(reader);
        adios2::DataType Type = (adios2::DataType)type;
        if (attrName == NULL)
        {
            // if attrName is NULL, prepare for attr reinstallation
            Reader->m_IO.RemoveAllAttributes();
            return;
        }
        try
        {
            if (Type == adios2::DataType::Struct)
            {
                return;
            }
            else if (Type == helper::GetDataType<std::string>())
            {
                Reader->m_IO.DefineAttribute<std::string>(attrName, *(char **)data, "", "/", true);
            }
#define declare_type(T)                                                                            \
    else if (Type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        Reader->m_IO.DefineAttribute<T>(attrName, *(T *)data, "", "/", true);                      \
    }

            ADIOS2_FOREACH_ATTRIBUTE_PRIMITIVE_STDTYPE_1ARG(declare_type)
#undef declare_type
            else
            {
                std::cout << "Loading attribute matched no type " << ToString(Type) << std::endl;
            }
        }
        catch (...)
        {
            //            std::cout << "Load failed" << std::endl;
            return;
        }
        return;
    };

    auto arrayFFSCallback = [](void *reader, const char *variableName, const int type, int DimCount,
                               size_t *Shape, size_t *Start, size_t *Count) {
        std::vector<size_t> VecShape;
        std::vector<size_t> VecStart;
        std::vector<size_t> VecCount;
        adios2::DataType Type = (adios2::DataType)type;
        class SstReader::SstReader *Reader = reinterpret_cast<class SstReader::SstReader *>(reader);
        /*
         * setup shape of array variable as global (I.E. Count == Shape,
         * Start == 0)
         */
        if (Shape)
        {
            for (int i = 0; i < DimCount; i++)
            {
                VecShape.push_back(Shape[i]);
                VecStart.push_back(0);
                VecCount.push_back(Shape[i]);
            }
        }
        else
        {
            VecShape = {};
            VecStart = {};
            for (int i = 0; i < DimCount; i++)
            {
                VecCount.push_back(Count[i]);
            }
        }

        if (Type == adios2::DataType::Struct)
        {
            return (void *)NULL;
        }
#define declare_type(T)                                                                            \
    else if (Type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        Variable<T> *variable =                                                                    \
            &(Reader->m_IO.DefineVariable<T>(variableName, VecShape, VecStart, VecCount));         \
        variable->m_AvailableStepsCount = 1;                                                       \
        Reader->RegisterCreatedVariable(variable);                                                 \
        return (void *)variable;                                                                   \
    }
        ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
        return (void *)NULL;
    };

    auto arrayBlocksInfoCallback = [](void *reader, void *variable, const int type, int WriterRank,
                                      int DimCount, size_t *Shape, size_t *Start, size_t *Count) {
        std::vector<size_t> VecShape;
        std::vector<size_t> VecStart;
        std::vector<size_t> VecCount;
        adios2::DataType Type = (adios2::DataType)type;
        class SstReader::SstReader *Reader = reinterpret_cast<class SstReader::SstReader *>(reader);
        size_t currentStep = SstCurrentStep(Reader->m_Input);

        /*
         * setup shape of array variable as global (I.E. Count == Shape,
         * Start == 0)
         */
        if (Shape)
        {
            for (int i = 0; i < DimCount; i++)
            {
                VecShape.push_back(Shape[i]);
                VecStart.push_back(Start[i]);
                VecCount.push_back(Count[i]);
            }
        }
        else
        {
            VecShape = {};
            VecStart = {};
            for (int i = 0; i < DimCount; i++)
            {
                VecCount.push_back(Count[i]);
            }
        }

        if (Type == adios2::DataType::Struct)
        {
            return;
        }
#define declare_type(T)                                                                            \
    else if (Type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        Variable<T> *Var = reinterpret_cast<class Variable<T> *>(variable);                        \
        auto savedShape = Var->m_Shape;                                                            \
        auto savedCount = Var->m_Count;                                                            \
        auto savedStart = Var->m_Start;                                                            \
        Var->m_Shape = VecShape;                                                                   \
        Var->m_Count = VecCount;                                                                   \
        Var->m_Start = VecStart;                                                                   \
        Var->SetBlockInfo((T *)NULL, currentStep);                                                 \
        Var->m_Shape = savedShape;                                                                 \
        Var->m_Count = savedCount;                                                                 \
        Var->m_Start = savedStart;                                                                 \
    }
        ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
        return;
    };

    auto MinArraySetupUpcall = [](void *reader, int DimCount, size_t *Shape) {
        MinVarInfo *MV = new MinVarInfo(DimCount, Shape);
        return (void *)MV;
    };
    auto arrayMinBlocksInfoCallback = [](void *reader, void *MV, const int type, int WriterRank,
                                         int DimCount, size_t *Shape, size_t *Start,
                                         size_t *Count) {
        MinBlockInfo MBI;
        MinVarInfo *MinVar = (MinVarInfo *)MV;

        MBI.WriterID = WriterRank;
        MBI.BlockID = 0;
        MBI.Start = Start;
        MBI.Count = Count;

        MinVar->BlocksInfo.push_back(MBI);
        return;
    };

    static int UseMin = 1;
    if (UseMin == -1)
    {
        if (getenv("OldBlocksInfo") == NULL)
        {
            UseMin = 0;
        }
        else
        {
            UseMin = 1;
        }
    }
    if (UseMin)
        SstReaderInitFFSCallback(m_Input, this, varFFSCallback, arrayFFSCallback,
                                 MinArraySetupUpcall, attrFFSCallback, arrayMinBlocksInfoCallback);
    else
        SstReaderInitFFSCallback(m_Input, this, varFFSCallback, arrayFFSCallback, NULL,
                                 attrFFSCallback, arrayBlocksInfoCallback);

    delete[] cstr;
    m_IsOpen = true;
}